

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O0

_Bool trans_mret(DisasContext_conflict12 *ctx,arg_mret *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGContext_conflict11 *tcg_ctx;
  arg_mret *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,(ctx->base).pc_next);
  gen_helper_mret(tcg_ctx_00,tcg_ctx_00->cpu_pc,tcg_ctx_00->cpu_env,tcg_ctx_00->cpu_pc);
  exit_tb(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return true;
}

Assistant:

static bool trans_mret(DisasContext *ctx, arg_mret *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);
    gen_helper_mret(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_env, tcg_ctx->cpu_pc);
    exit_tb(ctx); /* no chaining */
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}